

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int archive_write_set_format_mtree_default(archive *_a,char *fn)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,fn);
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)(_a + 2) != (code *)0x0) {
      (**(code **)(_a + 2))(_a);
    }
    pvVar2 = calloc(1,0x130);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate mtree data");
    }
    else {
      *(undefined4 *)((long)pvVar2 + 0x70) = 1;
      *(undefined4 *)((long)pvVar2 + 0x120) = 0x3d863a;
      *(long *)((long)pvVar2 + 0x38) = (long)pvVar2 + 0x30;
      *(void **)&_a[1].current_codepage = pvVar2;
      *(code **)(_a + 2) = archive_write_mtree_free;
      _a[1].sconv = (archive_string_conv *)0x4525d1;
      _a[1].read_data_offset = (int64_t)archive_write_mtree_options;
      _a[1].read_data_remaining = (size_t)archive_write_mtree_header;
      _a[1].read_data_requested = (size_t)archive_write_mtree_close;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_mtree_data;
      _a[1].read_data_output_offset = (int64_t)archive_write_mtree_finish_entry;
      _a->archive_format = 0x80000;
      _a->archive_format_name = "mtree";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
archive_write_set_format_mtree_default(struct archive *_a, const char *fn)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct mtree_writer *mtree;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW, fn);

	if (a->format_free != NULL)
		(a->format_free)(a);

	if ((mtree = calloc(1, sizeof(*mtree))) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate mtree data");
		return (ARCHIVE_FATAL);
	}

	mtree->mtree_entry = NULL;
	mtree->first = 1;
	memset(&(mtree->set), 0, sizeof(mtree->set));
	mtree->keys = DEFAULT_KEYS;
	mtree->dironly = 0;
	mtree->indent = 0;
	archive_string_init(&mtree->ebuf);
	archive_string_init(&mtree->buf);
	mtree_entry_register_init(mtree);
	a->format_data = mtree;
	a->format_free = archive_write_mtree_free;
	a->format_name = "mtree";
	a->format_options = archive_write_mtree_options;
	a->format_write_header = archive_write_mtree_header;
	a->format_close = archive_write_mtree_close;
	a->format_write_data = archive_write_mtree_data;
	a->format_finish_entry = archive_write_mtree_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_MTREE;
	a->archive.archive_format_name = "mtree";

	return (ARCHIVE_OK);
}